

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiWindow::~ImGuiWindow(ImGuiWindow *this)

{
  int *piVar1;
  ImDrawList *pIVar2;
  char *pcVar3;
  
  ImDrawList::~ImDrawList(this->DrawList);
  pIVar2 = this->DrawList;
  if (pIVar2 != (ImDrawList *)0x0) {
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(GImGui->IO).MemFreeFn)(pIVar2);
  this->DrawList = (ImDrawList *)0x0;
  pcVar3 = this->Name;
  if (pcVar3 != (char *)0x0) {
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(GImGui->IO).MemFreeFn)(pcVar3);
  this->Name = (char *)0x0;
  ImVector<ImGuiStorage::Pair>::~ImVector(&(this->StateStorage).Data);
  ImVector<unsigned_int>::~ImVector(&this->IDStack);
  ImVector<ImGuiColumnData>::~ImVector(&(this->DC).ColumnsData);
  ImVector<ImGuiGroupData>::~ImVector(&(this->DC).GroupStack);
  ImVector<float>::~ImVector(&(this->DC).TextWrapPosStack);
  ImVector<float>::~ImVector(&(this->DC).ItemWidthStack);
  ImVector<int>::~ImVector(&(this->DC).ItemFlagsStack);
  ImVector<ImGuiWindow_*>::~ImVector(&(this->DC).ChildWindows);
  return;
}

Assistant:

ImGuiWindow::~ImGuiWindow()
{
    DrawList->~ImDrawList();
    ImGui::MemFree(DrawList);
    DrawList = NULL;
    ImGui::MemFree(Name);
    Name = NULL;
}